

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuMatrix.c
# Opt level: O3

Fxu_Matrix * Fxu_MatrixAllocate(void)

{
  uint uVar1;
  uint uVar2;
  Fxu_Matrix *pFVar3;
  Fxu_ListDouble *pFVar4;
  Extra_MmFixed_t *pEVar5;
  Fxu_HeapDouble *pFVar6;
  Fxu_HeapSingle *pFVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  uint uVar10;
  int iVar11;
  
  pFVar3 = (Fxu_Matrix *)calloc(1,0xd0);
  uVar10 = 9999;
  while( true ) {
    do {
      uVar1 = uVar10 + 1;
      uVar2 = uVar10 & 1;
      uVar10 = uVar1;
    } while (uVar2 != 0);
    if (uVar1 < 9) break;
    iVar11 = 5;
    while (uVar1 % (iVar11 - 2U) != 0) {
      uVar2 = iVar11 * iVar11;
      iVar11 = iVar11 + 2;
      if (uVar1 < uVar2) goto LAB_004c043f;
    }
  }
LAB_004c043f:
  pFVar3->nTableSize = uVar1;
  pFVar4 = (Fxu_ListDouble *)calloc(1,(long)(int)uVar1 * 0x18);
  pFVar3->pTable = pFVar4;
  pEVar5 = Extra_MmFixedStart(0x48);
  pFVar3->pMemMan = pEVar5;
  pFVar6 = Fxu_HeapDoubleStart();
  pFVar3->pHeapDouble = pFVar6;
  pFVar7 = Fxu_HeapSingleStart();
  pFVar3->pHeapSingle = pFVar7;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 100;
  pVVar8->nSize = 0;
  ppvVar9 = (void **)malloc(800);
  pVVar8->pArray = ppvVar9;
  pFVar3->vPairs = pVVar8;
  return pFVar3;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Fxu_Matrix * Fxu_MatrixAllocate()
{
    Fxu_Matrix * p;
    p = ABC_ALLOC( Fxu_Matrix, 1 );
    memset( p, 0, sizeof(Fxu_Matrix) );
    p->nTableSize = Abc_PrimeCudd(10000);
    p->pTable = ABC_ALLOC( Fxu_ListDouble, p->nTableSize );
    memset( p->pTable, 0, sizeof(Fxu_ListDouble) * p->nTableSize );
#ifndef USE_SYSTEM_MEMORY_MANAGEMENT
    {
        // get the largest size in bytes for the following structures:
        // Fxu_Cube, Fxu_Var, Fxu_Lit, Fxu_Pair, Fxu_Double, Fxu_Single
        // (currently, Fxu_Var, Fxu_Pair, Fxu_Double take 10 machine words)
        int nSizeMax, nSizeCur;
        nSizeMax = -1;
        nSizeCur = sizeof(Fxu_Cube);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Var);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Lit);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Pair);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Double);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        nSizeCur = sizeof(Fxu_Single);
        if ( nSizeMax < nSizeCur )
             nSizeMax = nSizeCur;
        p->pMemMan  = Extra_MmFixedStart( nSizeMax ); 
    }
#endif
    p->pHeapDouble = Fxu_HeapDoubleStart();
    p->pHeapSingle = Fxu_HeapSingleStart();
    p->vPairs = Vec_PtrAlloc( 100 );
    return p;
}